

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O3

void __thiscall Rml::DataModel::OnElementRemove(DataModel *this,Element *element)

{
  Element *local_28;
  Element *local_20;
  
  local_28 = element;
  local_20 = element;
  robin_hood::detail::
  Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
  ::erase(&this->aliases,&local_20);
  DataViews::OnElementRemove
            ((this->views)._M_t.
             super___uniq_ptr_impl<Rml::DataViews,_std::default_delete<Rml::DataViews>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataViews_*,_std::default_delete<Rml::DataViews>_>.
             super__Head_base<0UL,_Rml::DataViews_*,_false>._M_head_impl,element);
  DataControllers::OnElementRemove
            ((this->controllers)._M_t.
             super___uniq_ptr_impl<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::DataControllers_*,_std::default_delete<Rml::DataControllers>_>
             .super__Head_base<0UL,_Rml::DataControllers_*,_false>._M_head_impl,element);
  itlib::
  flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
  ::erase<Rml::Element*>
            ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
              *)&this->attached_elements,&local_28);
  return;
}

Assistant:

void DataModel::OnElementRemove(Element* element)
{
	EraseAliases(element);
	views->OnElementRemove(element);
	controllers->OnElementRemove(element);
	attached_elements.erase(element);
}